

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::syntax::PropertyCaseItemSyntax*>::
emplaceRealloc<slang::syntax::PropertyCaseItemSyntax*>
          (SmallVectorBase<slang::syntax::PropertyCaseItemSyntax*> *this,pointer pos,
          PropertyCaseItemSyntax **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppPVar3;
  PropertyCaseItemSyntax **__result;
  PropertyCaseItemSyntax **ppPVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  PropertyCaseItemSyntax **args_local;
  pointer pos_local;
  SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::max_size
                    ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::calculateGrowth
                       ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*> *)this,
                        *(long *)(this + 8) + 1);
  ppPVar3 = SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::begin
                      ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*> *)this);
  __result = (PropertyCaseItemSyntax **)slang::detail::allocArray(capacity,8);
  ppPVar4 = __result + ((long)pos - (long)ppPVar3 >> 3);
  *ppPVar4 = *args;
  ppPVar3 = SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::end
                      ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*> *)this);
  if (pos == ppPVar3) {
    ppPVar3 = SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::PropertyCaseItemSyntax**,slang::syntax::PropertyCaseItemSyntax**>
              (ppPVar3,(PropertyCaseItemSyntax **)ctx,__result);
  }
  else {
    ppPVar3 = SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::PropertyCaseItemSyntax**,slang::syntax::PropertyCaseItemSyntax**>
              (ppPVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::PropertyCaseItemSyntax**,slang::syntax::PropertyCaseItemSyntax**>
              (pos,(PropertyCaseItemSyntax **)ctx,ppPVar4 + 1);
  }
  SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::cleanup
            ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(PropertyCaseItemSyntax ***)this = __result;
  return ppPVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}